

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::InstDebugPrintfPass::ProcessImpl(InstDebugPrintfPass *this)

{
  IRContext *this_00;
  bool bVar1;
  DefUseManager *this_01;
  Instruction *pIVar2;
  Operand *this_02;
  Instruction **ppIVar3;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  string set_name;
  
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(spvtools::opt::InstructionList::iterator,_spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,_false>,_unsigned_int,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp:446:7)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(spvtools::opt::InstructionList::iterator,_spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,_false>,_unsigned_int,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp:446:7)>
             ::_M_manager;
  local_70._M_unused._M_object = this;
  InstrumentPass::InstProcessEntryPointCallTree
            (&this->super_InstrumentPass,(InstProcessFunction *)&local_70);
  this_01 = Pass::get_def_use_mgr((Pass *)this);
  pIVar2 = analysis::DefUseManager::GetDef
                     (this_01,*(uint32_t *)&(this->super_InstrumentPass).field_0x244);
  IRContext::KillInst((this->super_InstrumentPass).super_Pass.context_,pIVar2);
  ppIVar3 = (Instruction **)
            ((long)&(((((this->super_InstrumentPass).super_Pass.context_)->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                    ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  do {
    pIVar2 = *ppIVar3;
    this_00 = (this->super_InstrumentPass).super_Pass.context_;
    if (pIVar2 == (Instruction *)
                  ((long)&(((this_00->module_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                          ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 8U))
    {
      IRContext::RemoveExtension(this_00,kSPV_KHR_non_semantic_info);
      break;
    }
    this_02 = Instruction::GetInOperand(pIVar2,0);
    Operand::AsString_abi_cxx11_(&set_name,this_02);
    bVar1 = utils::starts_with(&set_name,"NonSemantic.");
    std::__cxx11::string::_M_dispose();
    ppIVar3 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while (!bVar1);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  return SuccessWithChange;
}

Assistant:

Pass::Status InstDebugPrintfPass::ProcessImpl() {
  // Perform printf instrumentation on each entry point function in module
  InstProcessFunction pfn =
      [this](BasicBlock::iterator ref_inst_itr,
             UptrVectorIterator<BasicBlock> ref_block_itr,
             [[maybe_unused]] uint32_t stage_idx,
             std::vector<std::unique_ptr<BasicBlock>>* new_blocks) {
        return GenDebugPrintfCode(ref_inst_itr, ref_block_itr, new_blocks);
      };
  (void)InstProcessEntryPointCallTree(pfn);
  // Remove DebugPrintf OpExtInstImport instruction
  Instruction* ext_inst_import_inst =
      get_def_use_mgr()->GetDef(ext_inst_printf_id_);
  context()->KillInst(ext_inst_import_inst);
  // If no remaining non-semantic instruction sets, remove non-semantic debug
  // info extension from module and feature manager
  bool non_sem_set_seen = false;
  for (auto c_itr = context()->module()->ext_inst_import_begin();
       c_itr != context()->module()->ext_inst_import_end(); ++c_itr) {
    const std::string set_name = c_itr->GetInOperand(0).AsString();
    if (spvtools::utils::starts_with(set_name, "NonSemantic.")) {
      non_sem_set_seen = true;
      break;
    }
  }
  if (!non_sem_set_seen) {
    context()->RemoveExtension(kSPV_KHR_non_semantic_info);
  }
  return Status::SuccessWithChange;
}